

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MacroArgumentDefaultSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroArgumentDefaultSyntax,slang::parsing::Token&,std::span<slang::parsing::Token,18446744073709551615ul>>
          (BumpAllocator *this,Token *args,
          span<slang::parsing::Token,_18446744073709551615UL> *args_1)

{
  pointer pTVar1;
  size_t sVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  MacroArgumentDefaultSyntax *pMVar8;
  uint uStack_24;
  
  pMVar8 = (MacroArgumentDefaultSyntax *)allocate(this,0x60,8);
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar3 = args->info;
  pTVar1 = args_1->_M_ptr;
  sVar2 = (args_1->_M_extent)._M_extent_value;
  (pMVar8->super_SyntaxNode).kind = MacroArgumentDefault;
  (pMVar8->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pMVar8->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pMVar8->equals).kind = TVar4;
  (pMVar8->equals).field_0x2 = uVar5;
  (pMVar8->equals).numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar8->equals).rawLen = uVar7;
  (pMVar8->equals).info = pIVar3;
  (pMVar8->tokens).super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
  *(ulong *)&(pMVar8->tokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = (ulong)uStack_24;
  *(undefined8 *)((long)&(pMVar8->tokens).super_SyntaxListBase.super_SyntaxNode.parent + 4) = 0;
  *(undefined4 *)((long)&(pMVar8->tokens).super_SyntaxListBase.super_SyntaxNode.previewNode + 4) = 0
  ;
  (pMVar8->tokens).super_SyntaxListBase.childCount = sVar2;
  (pMVar8->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = pTVar1;
  (pMVar8->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pMVar8->tokens).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002dac28;
  (pMVar8->tokens).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pMVar8;
  return pMVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }